

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_event_push(ui_event *ke)

{
  uint16_t uVar1;
  ui_event *puVar2;
  term *ptVar3;
  ushort uVar4;
  
  ptVar3 = Term;
  if (ke != (ui_event *)0x0) {
    uVar1 = Term->key_tail;
    if (uVar1 == 0) {
      uVar1 = Term->key_size;
    }
    puVar2 = Term->key_queue;
    uVar4 = uVar1 - 1;
    Term->key_tail = uVar4;
    *(undefined4 *)((long)puVar2 + (ulong)uVar4 * 0xc + 8) = *(undefined4 *)&(ke->key).mods;
    puVar2[uVar4].mouse = ke->mouse;
    return (errr)(ptVar3->key_head == ptVar3->key_tail);
  }
  return -1;
}

Assistant:

errr Term_event_push(const ui_event *ke)
{
	/* Hack -- Refuse to enqueue non-keys */
	if (!ke) return (-1);

	/* Hack -- Overflow may induce circular queue */
	if (Term->key_tail == 0) Term->key_tail = Term->key_size;

	/* Back up, Store the char */
	/* Store the char, advance the queue */
	Term->key_queue[--Term->key_tail] = *ke;

	/* Success (unless overflow) */
	if (Term->key_head != Term->key_tail) return (0);

	/* Problem */
	return (1);
}